

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::BamHttp::ParseUrl(BamHttp *this,string *url)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  string tempUrl;
  string filename;
  string hostname;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this->m_isUrlParsed = false;
  pcVar1 = (url->_M_dataplus)._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + url->_M_string_length);
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  std::__cxx11::string::reserve((ulong)&local_50);
  if (local_a8 != 0) {
    lVar3 = 0;
    do {
      iVar2 = tolower((int)(char)local_b0[lVar3]);
      local_50[lVar3] = (char)iVar2;
      lVar3 = lVar3 + 1;
    } while (local_a8 != lVar3);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  lVar3 = std::__cxx11::string::find((char *)&local_b0,HTTP_PREFIX_abi_cxx11_,0);
  if (lVar3 != -1) {
    std::__cxx11::string::find((char)&local_b0,0x2f);
    std::__cxx11::string::substr((ulong)local_70,(ulong)&local_b0);
    lVar3 = std::__cxx11::string::find((char)local_70,0x3a);
    if (lVar3 == -1) {
      std::__cxx11::string::_M_assign((string *)&this->m_hostname);
      std::__cxx11::string::_M_assign((string *)&this->m_port);
    }
    std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_b0);
    if (local_88 != 0) {
      std::__cxx11::string::_M_assign((string *)&this->m_filename);
      this->m_isUrlParsed = true;
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return;
}

Assistant:

void BamHttp::ParseUrl(const string& url) {

    // clear flag to start
    m_isUrlParsed = false;

    // make sure url starts with "http://", case-insensitive
    string tempUrl(url);
    toLower(tempUrl);
    const size_t prefixFound = tempUrl.find(HTTP_PREFIX);
    if ( prefixFound == string::npos )
        return;

    // find end of host name portion (first '/' hit after the prefix)
    const size_t firstSlashFound = tempUrl.find(HOST_SEPARATOR, HTTP_PREFIX_LENGTH);
    if ( firstSlashFound == string::npos ) {
        ;  // no slash found... no filename given along with host?
    }

    // fetch hostname (check for proxy port)
    string hostname = tempUrl.substr(HTTP_PREFIX_LENGTH, (firstSlashFound - HTTP_PREFIX_LENGTH));
    const size_t colonFound = hostname.find(PROXY_SEPARATOR);
    if ( colonFound != string::npos ) {
        ; // TODO: handle proxy port (later, just skip for now)
    } else {
        m_hostname = hostname;
        m_port = HTTP_PORT;
    }

    // store remainder of URL as filename (must be non-empty)
    string filename = tempUrl.substr(firstSlashFound);
    if ( filename.empty() )
        return;
    m_filename = filename;

    // set parsed OK flag
    m_isUrlParsed = true;
}